

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::tryRead
          (BlockedPumpFrom *this,void *readBuffer,size_t minBytes,size_t maxBytes)

{
  Canceler *adapterConstructorParams;
  PromiseArena *pPVar1;
  SourceLocation location;
  PromiseBase PVar2;
  OwnPromiseNode OVar3;
  void *pvVar4;
  ulong uVar5;
  size_t sVar6;
  TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:780:17),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
  *location_00;
  bool bVar7;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_b8;
  OwnPromiseNode local_b0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a8;
  code *local_a0;
  char *local_98;
  char *pcStack_90;
  undefined8 local_88;
  PromiseBase local_80;
  anon_class_16_2_d8ee3cd1 local_78;
  OwnPromiseNode local_68;
  anon_class_40_5_41c1fbba_for_func local_60;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  bVar7 = *(long *)((long)readBuffer + 0x38) == 0;
  local_98 = (char *)CONCAT71(local_98._1_7_,bVar7);
  local_80.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  if (bVar7) {
    adapterConstructorParams = (Canceler *)((long)readBuffer + 0x38);
    uVar5 = *(long *)((long)readBuffer + 0x28) - *(long *)((long)readBuffer + 0x30);
    sVar6 = maxBytes;
    if (uVar5 < maxBytes) {
      sVar6 = uVar5;
    }
    (**(code **)(**(long **)((long)readBuffer + 0x20) + 8))
              (&local_b8,*(long **)((long)readBuffer + 0x20),minBytes,sVar6);
    local_78.fulfiller = *(PromiseFulfiller<unsigned_long> **)((long)readBuffer + 0x10);
    local_98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
    ;
    pcStack_90 = "tryRead";
    local_88 = 0x1c0000030b;
    local_a0 = kj::_::
               TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:780:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
               ::anon_class_40_5_41c1fbba_for_func::operator();
    pPVar1 = ((local_b8.ptr)->super_PromiseArenaMember).arena;
    local_78.canceler = adapterConstructorParams;
    local_60.this = (BlockedPumpFrom *)readBuffer;
    local_60.readBuffer = (void *)minBytes;
    local_60.minBytes = maxBytes;
    local_60.min = sVar6;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_b8.ptr - (long)pPVar1) < 0x58) {
      pvVar4 = operator_new(0x400);
      location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:780:17),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                     *)((long)pvVar4 + 0x3a8);
      ctor<kj::_::TransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_00,&local_b8,&local_60,&local_78,&local_a0);
      *(void **)((long)pvVar4 + 0x3b0) = pvVar4;
    }
    else {
      ((local_b8.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:780:17),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                     *)&local_b8.ptr[-6].super_PromiseArenaMember.arena;
      ctor<kj::_::TransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_00,&local_b8,&local_60,&local_78,&local_a0);
      local_b8.ptr[-5].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    location.function = pcStack_90;
    location.fileName = local_98;
    location.lineNumber = (undefined4)local_88;
    location.columnNumber = local_88._4_4_;
    local_a8.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<unsigned_long>(&local_68,(Promise<unsigned_long> *)&local_a8,location);
    OVar3.ptr = local_68.ptr;
    local_68.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
    local_b0.ptr = OVar3.ptr;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a8);
    PVar2.node.ptr = local_80.node.ptr;
    newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
              ((kj *)local_80.node.ptr,adapterConstructorParams,(Promise<unsigned_long> *)&local_b0)
    ;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_b0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_b8);
    return (Promise<unsigned_long>)(PromiseNode *)PVar2.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            ((Fault *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x306,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
             (DebugExpression<bool> *)&local_98,(char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal((Fault *)&local_60);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}